

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O3

vector<OpTpl_*,_std::allocator<OpTpl_*>_> * __thiscall
PcodeCompile::newOutput
          (PcodeCompile *this,bool usesLocalKey,ExprTree *rhs,string *varname,uint4 size)

{
  VarnodeTpl *pVVar1;
  pointer pcVar2;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar3;
  int iVar4;
  VarnodeTpl *newout;
  VarnodeSymbol *this_00;
  undefined4 extraout_var;
  long *plVar5;
  uintb *puVar6;
  const_type cVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  v_field vVar14;
  uintb *local_70;
  anon_union_8_2_16792c89_for_value aStack_68;
  undefined8 local_60;
  v_field vStack_58;
  undefined4 uStack_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  newout = buildTemporary(this);
  if (size == 0) {
    pVVar1 = rhs->outvn;
    if (((pVVar1->size).type != real) || ((pVVar1->size).value_real == 0)) goto LAB_0033446b;
    cVar7 = (pVVar1->size).type;
    uVar8 = *(undefined4 *)&(pVVar1->size).field_0x4;
    uVar9 = (pVVar1->size).value.handle_index;
    uVar10 = *(undefined4 *)((long)&(pVVar1->size).value + 4);
    uVar11 = *(undefined4 *)((long)&(pVVar1->size).value + 4);
    uVar12 = (undefined4)(pVVar1->size).value_real;
    uVar13 = *(undefined4 *)((long)&(pVVar1->size).value_real + 4);
    vVar14 = (pVVar1->size).select;
  }
  else {
    ConstTpl::ConstTpl((ConstTpl *)&local_70,real,(ulong)size);
    cVar7 = (const_type)local_70;
    uVar8 = local_70._4_4_;
    uVar9 = aStack_68.handle_index;
    uVar10 = aStack_68._4_4_;
    uVar11 = aStack_68._4_4_;
    uVar12 = (undefined4)local_60;
    uVar13 = local_60._4_4_;
    vVar14 = vStack_58;
  }
  *(undefined4 *)((long)&(newout->size).value + 4) = uVar11;
  *(undefined4 *)&(newout->size).value_real = uVar12;
  *(undefined4 *)((long)&(newout->size).value_real + 4) = uVar13;
  (newout->size).select = vVar14;
  (newout->size).type = cVar7;
  *(undefined4 *)&(newout->size).field_0x4 = uVar8;
  (newout->size).value.handle_index = uVar9;
  *(undefined4 *)((long)&(newout->size).value + 4) = uVar10;
LAB_0033446b:
  ExprTree::setOutput(rhs,newout);
  this_00 = (VarnodeSymbol *)operator_new(0x58);
  VarnodeSymbol::VarnodeSymbol
            (this_00,varname,(newout->space).value.spaceid,(newout->offset).value_real,
             (int4)(newout->size).value_real);
  (*this->_vptr_PcodeCompile[1])(this,this_00);
  if ((!usesLocalKey) && (this->enforceLocalKey == true)) {
    iVar4 = (*this->_vptr_PcodeCompile[4])(this,this_00);
    std::operator+(&local_50,"Must use \'local\' keyword to define symbol \'",varname);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar6 = (uintb *)(plVar5 + 2);
    if ((uintb *)*plVar5 == puVar6) {
      local_60 = *puVar6;
      vStack_58 = *(v_field *)(plVar5 + 3);
      uStack_54 = *(undefined4 *)((long)plVar5 + 0x1c);
      local_70 = &local_60;
    }
    else {
      local_60 = *puVar6;
      local_70 = (uintb *)*plVar5;
    }
    aStack_68 = *(anon_union_8_2_16792c89_for_value *)(plVar5 + 1);
    *plVar5 = (long)puVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    (*this->_vptr_PcodeCompile[5])(this,CONCAT44(extraout_var,iVar4));
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  pcVar2 = (varname->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &varname->field_2) {
    operator_delete(pcVar2);
  }
  operator_delete(varname);
  pvVar3 = rhs->ops;
  rhs->ops = (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)0x0;
  ExprTree::~ExprTree(rhs);
  operator_delete(rhs);
  return pvVar3;
}

Assistant:

vector<OpTpl *> *PcodeCompile::newOutput(bool usesLocalKey,ExprTree *rhs,string *varname,uint4 size)

{
  VarnodeSymbol *sym;
  VarnodeTpl *tmpvn = buildTemporary();
  if (size != 0)
    tmpvn->setSize(ConstTpl(ConstTpl::real,size)); // Size was explicitly specified
  else if ((rhs->getSize().getType()==ConstTpl::real)&&(rhs->getSize().getReal()!=0))
    tmpvn->setSize(rhs->getSize());	// Inherit size from unnamed expression result
				// Only inherit if the size is real, otherwise we
				// cannot build the VarnodeSymbol with a placeholder constant
  rhs->setOutput(tmpvn);
  sym = new VarnodeSymbol(*varname,tmpvn->getSpace().getSpace(),tmpvn->getOffset().getReal(),tmpvn->getSize().getReal()); // Create new symbol regardless
  addSymbol(sym);
  if ((!usesLocalKey) && enforceLocalKey)
    reportError(getLocation(sym), "Must use 'local' keyword to define symbol '"+*varname + "'");
  delete varname;
  return ExprTree::toVector(rhs);
}